

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O1

Gia_Man_t * Gia_ManEquivToChoices(Gia_Man_t *p,int nSnapshots)

{
  int iVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  Gia_Man_t *p_00;
  size_t sVar4;
  char *pcVar5;
  Gia_Rpr_t *pGVar6;
  int *piVar7;
  long lVar8;
  Gia_Obj_t *pGVar9;
  Vec_Int_t *pVVar10;
  Gia_Man_t *pGVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  Gia_Obj_t *pGVar17;
  
  if (p->vCos->nSize % nSnapshots != 0) {
    __assert_fail("(Gia_ManCoNum(p) % nSnapshots) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                  ,0x7bc,"Gia_Man_t *Gia_ManEquivToChoices(Gia_Man_t *, int)");
  }
  Gia_ManSetPhase(p);
  p_00 = Gia_ManStart(p->nObjs);
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar5 = (char *)0x0;
  }
  else {
    sVar4 = strlen(pcVar2);
    pcVar5 = (char *)malloc(sVar4 + 1);
    strcpy(pcVar5,pcVar2);
  }
  p_00->pSpec = pcVar5;
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar5 = (char *)0x0;
  }
  else {
    sVar4 = strlen(pcVar2);
    pcVar5 = (char *)malloc(sVar4 + 1);
    strcpy(pcVar5,pcVar2);
  }
  p_00->pName = pcVar5;
  iVar1 = p->nObjs;
  pGVar6 = (Gia_Rpr_t *)calloc((long)iVar1,4);
  p_00->pReprs = pGVar6;
  piVar7 = (int *)calloc((long)iVar1,4);
  p_00->pNexts = piVar7;
  if (0 < p->nObjs) {
    lVar8 = 0;
    do {
      p_00->pReprs[lVar8] = (Gia_Rpr_t)((uint)p_00->pReprs[lVar8] | 0xfffffff);
      lVar8 = lVar8 + 1;
    } while (lVar8 < p->nObjs);
  }
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  pVVar10 = p->vCis;
  uVar12 = pVVar10->nSize;
  uVar13 = (ulong)uVar12;
  if (0 < (int)uVar12) {
    lVar8 = 0;
    do {
      uVar12 = (uint)uVar13;
      iVar1 = pVVar10->pArray[lVar8];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_00202b69;
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      pGVar9 = Gia_ManAppendObj(p_00);
      uVar13 = *(ulong *)pGVar9;
      *(ulong *)pGVar9 = uVar13 | 0x9fffffff;
      *(ulong *)pGVar9 =
           uVar13 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar17 = p_00->pObjs;
      if ((pGVar9 < pGVar17) || (pGVar17 + p_00->nObjs <= pGVar9)) {
LAB_00202b88:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar17) >> 2) * -0x55555555);
      pGVar17 = p_00->pObjs;
      if ((pGVar9 < pGVar17) || (pGVar17 + p_00->nObjs <= pGVar9)) goto LAB_00202b88;
      pGVar3[iVar1].Value = (int)((ulong)((long)pGVar9 - (long)pGVar17) >> 2) * 0x55555556;
      lVar8 = lVar8 + 1;
      pVVar10 = p->vCis;
      uVar12 = pVVar10->nSize;
      uVar13 = (ulong)(int)uVar12;
    } while (lVar8 < (long)uVar13);
  }
  lVar8 = (long)p->nRegs;
  if (0 < lVar8) {
    uVar14 = uVar12 - p->nRegs;
    uVar13 = (ulong)uVar14;
    do {
      if (((int)uVar13 < 0) || ((int)uVar12 <= (int)uVar13)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      lVar15 = (long)pVVar10->pArray[uVar13];
      if ((lVar15 < 0) || (p->nObjs <= pVVar10->pArray[uVar13])) goto LAB_00202b69;
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      uVar16 = (ulong)(uint)p->pReprs[lVar15] & 0xfffffff;
      if (uVar16 == 0xfffffff) {
        pGVar17 = (Gia_Obj_t *)0x0;
      }
      else {
        if (p->nObjs <= (int)uVar16) goto LAB_00202b69;
        pGVar17 = pGVar3 + uVar16;
      }
      if (pGVar17 != (Gia_Obj_t *)0x0) {
        uVar16 = *(ulong *)pGVar17;
        if (((~uVar16 & 0x1fffffff1fffffff) != 0) &&
           ((((uint)uVar16 & 0x9fffffff) != 0x9fffffff ||
            ((int)((uint)(uVar16 >> 0x20) & 0x1fffffff) < (int)uVar14)))) {
          __assert_fail("Gia_ObjIsConst0(pRepr) || Gia_ObjIsRo(p, pRepr)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                        ,0x7cc,"Gia_Man_t *Gia_ManEquivToChoices(Gia_Man_t *, int)");
        }
        pGVar3[lVar15].Value = pGVar17->Value;
      }
      uVar13 = uVar13 + 1;
      lVar8 = lVar8 + -1;
    } while (lVar8 != 0);
  }
  Gia_ManHashAlloc(p_00);
  pVVar10 = p->vCos;
  if (0 < pVVar10->nSize) {
    lVar8 = 0;
    do {
      iVar1 = pVVar10->pArray[lVar8];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_00202b69;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar3 = p->pObjs + iVar1;
      Gia_ManEquivToChoices_rec(p_00,p,pGVar3 + -(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff));
      lVar8 = lVar8 + 1;
      pVVar10 = p->vCos;
    } while (lVar8 < pVVar10->nSize);
  }
  pVVar10 = Gia_ManGetDangling(p);
  if (0 < pVVar10->nSize) {
    lVar8 = 0;
    do {
      iVar1 = pVVar10->pArray[lVar8];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_00202b69;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      Gia_ManEquivToChoices_rec(p_00,p,p->pObjs + iVar1);
      lVar8 = lVar8 + 1;
    } while (lVar8 < pVVar10->nSize);
  }
  if (pVVar10->pArray != (int *)0x0) {
    free(pVVar10->pArray);
    pVVar10->pArray = (int *)0x0;
  }
  if (pVVar10 != (Vec_Int_t *)0x0) {
    free(pVVar10);
  }
  pVVar10 = p->vCos;
  if (0 < pVVar10->nSize) {
    uVar13 = 0;
    do {
      iVar1 = pVVar10->pArray[uVar13];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
LAB_00202b69:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if ((int)((long)((ulong)(uint)((int)uVar13 >> 0x1f) << 0x20 | uVar13 & 0xffffffff) %
               (long)nSnapshots) == 0) {
        pGVar3 = p->pObjs + iVar1;
        uVar14 = (uint)*(undefined8 *)pGVar3;
        uVar12 = pGVar3[-(ulong)(uVar14 & 0x1fffffff)].Value;
        if ((int)uVar12 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        Gia_ManAppendCo(p_00,uVar14 >> 0x1d & 1 ^ uVar12);
      }
      uVar13 = uVar13 + 1;
      pVVar10 = p->vCos;
    } while ((long)uVar13 < (long)pVVar10->nSize);
  }
  Gia_ManHashStop(p_00);
  Gia_ManSetRegNum(p_00,p->nRegs);
  Gia_ManRemoveBadChoices(p_00);
  pGVar11 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar11;
}

Assistant:

Gia_Man_t * Gia_ManEquivToChoices( Gia_Man_t * p, int nSnapshots )
{
    Vec_Int_t * vNodes;
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pRepr;
    int i;
//Gia_ManEquivPrintClasses( p, 0, 0 );
    assert( (Gia_ManCoNum(p) % nSnapshots) == 0 );
    Gia_ManSetPhase( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pReprs = ABC_CALLOC( Gia_Rpr_t, Gia_ManObjNum(p) );
    pNew->pNexts = ABC_CALLOC( int, Gia_ManObjNum(p) );
    for ( i = 0; i < Gia_ManObjNum(p); i++ )
        Gia_ObjSetRepr( pNew, i, GIA_VOID );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManForEachRo( p, pObj, i )
        if ( (pRepr = Gia_ObjReprObj(p, Gia_ObjId(p, pObj))) )
        {
            assert( Gia_ObjIsConst0(pRepr) || Gia_ObjIsRo(p, pRepr) );
            pObj->Value = pRepr->Value;
        }
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManEquivToChoices_rec( pNew, p, Gia_ObjFanin0(pObj) );
    vNodes = Gia_ManGetDangling( p );
    Gia_ManForEachObjVec( vNodes, p, pObj, i )
        Gia_ManEquivToChoices_rec( pNew, p, pObj );
    Vec_IntFree( vNodes );
    Gia_ManForEachCo( p, pObj, i )
        if ( i % nSnapshots == 0 )
            Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    Gia_ManRemoveBadChoices( pNew );
//Gia_ManEquivPrintClasses( pNew, 0, 0 );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
//Gia_ManEquivPrintClasses( pNew, 0, 0 );
    return pNew;
}